

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Constraint * __thiscall am_CList::Remove_Con(am_CList *this,CItem *item)

{
  Am_Constraint *pAVar1;
  Am_Constraint *value;
  CItem *curr;
  CItem *prev;
  CItem *item_local;
  am_CList *this_local;
  
  curr = (CItem *)0x0;
  for (value = (Am_Constraint *)this->head; value != (Am_Constraint *)0x0;
      value = (Am_Constraint *)value[2].super_Am_Registered_Type._vptr_Am_Registered_Type) {
    if (item == (CItem *)value) {
      if (curr == (CItem *)0x0) {
        this->head = (CItem *)value[2].super_Am_Registered_Type._vptr_Am_Registered_Type;
      }
      else {
        curr->next = (CItem *)value[2].super_Am_Registered_Type._vptr_Am_Registered_Type;
      }
    }
    curr = (CItem *)value;
  }
  pAVar1 = item->value;
  (item->field_1).prev = (CItem *)0x0;
  item->next = (CItem *)0x0;
  item->value = (Am_Constraint *)0x0;
  if (item != (CItem *)0x0) {
    CItem::operator_delete(item,0x18);
  }
  return pAVar1;
}

Assistant:

Am_Constraint *
am_CList::Remove_Con(CItem *item)
{
  CItem *prev = nullptr;
  CItem *curr = head;
  while (curr) {
    if (item == curr) {
      if (prev)
        prev->next = curr->next;
      else
        head = curr->next;
    }
    prev = curr;
    curr = curr->next;
  }
  Am_Constraint *value = item->value;
  item->prev = nullptr;
  item->next = nullptr;
  item->value = nullptr;
  delete item;
  return value;
}